

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

void delete_ast_compound_statement(AST_Compound_Statement *compound_statement)

{
  AST *ast;
  
  if (compound_statement->scope != (Scope *)0x0) {
    delete_scope(compound_statement->scope);
  }
  if ((compound_statement->components).size != 0) {
    do {
      ast = (AST *)Queue_Pop(&compound_statement->components);
      delete_ast(ast);
    } while ((compound_statement->components).size != 0);
  }
  free(compound_statement);
  return;
}

Assistant:

void delete_ast_compound_statement(struct AST_Compound_Statement *compound_statement)
{
	if(compound_statement->scope!=NULL)
		delete_scope(compound_statement->scope);
	while(compound_statement->components.size>0)
		delete_ast((struct AST*)Queue_Pop(&compound_statement->components));
	free(compound_statement);
}